

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_alloc.c
# Opt level: O0

void free_checked(int *ptr)

{
  int iVar1;
  int pos;
  int *ptr_local;
  
  if ((*ptr < 1000) && (ptr[((ulong)(long)ptr[1] >> 2) - 1] == *ptr)) {
    iVar1 = *ptr;
    if (ptrs[iVar1] != ptr) {
      fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n","ptrs[pos] == ptr",
              "false",
              "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c"
              ,0x1f,"free_checked");
      exit(-1);
    }
    ptrs[iVar1][((ulong)(long)ptr[1] >> 2) - 1] = 0x7fffffff;
    *ptrs[iVar1] = 0x7fffffff;
    smfree(&alloc,ptrs[iVar1],(long)ptrs[iVar1][1]);
    ptrs[iVar1] = (int *)0x0;
    return;
  }
  fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",
          "ptr[0] < OBJECTS_MAX && ptr[ptr[1]/sizeof(int)-1] == ptr[0]","false",
          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/test/small_alloc.c",
          0x1d,"free_checked");
  exit(-1);
}

Assistant:

static inline void
free_checked(int *ptr)
{
	fail_unless(ptr[0] < OBJECTS_MAX &&
		    ptr[ptr[1]/sizeof(int)-1] == ptr[0]);
	int pos = ptr[0];
	fail_unless(ptrs[pos] == ptr);
	ptrs[pos][0] = ptrs[pos][ptr[1]/sizeof(int)-1] = INT_MAX;
	smfree(&alloc, ptrs[pos], ptrs[pos][1]);
	ptrs[pos] = NULL;
}